

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool __thiscall
tinygltf::TinyGLTF::WriteGltfSceneToStream
          (TinyGLTF *this,Model *model,ostream *stream,bool prettyPrint,bool writeBinary)

{
  size_type sVar1;
  reference buffer_00;
  reference pvVar2;
  string local_118;
  string local_f8;
  allocator local_d1;
  undefined1 local_d0 [8];
  string dummystring;
  json image;
  undefined1 local_98 [4];
  uint i_1;
  json images;
  json buffer;
  undefined1 local_70 [4];
  uint i;
  json buffers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedUris;
  undefined1 local_38 [8];
  JsonDocument output;
  bool writeBinary_local;
  bool prettyPrint_local;
  ostream *stream_local;
  Model *model_local;
  TinyGLTF *this_local;
  
  output.m_value.number_integer._6_1_ = writeBinary;
  output.m_value.number_integer._7_1_ = prettyPrint;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_38,(nullptr_t)0x0);
  SerializeGltfModel(model,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&buffers.m_value);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_70,(nullptr_t)0x0);
  sVar1 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::size(&model->buffers);
  anon_unknown_57::JsonReserveArray
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_70,sVar1);
  buffer.m_value.number_integer._4_4_ = 0;
  while( true ) {
    sVar1 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::size(&model->buffers);
    if (sVar1 <= (uint)buffer.m_value.number_unsigned._4_4_) break;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&images.m_value,(nullptr_t)0x0);
    buffer_00 = std::vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>::operator[]
                          (&model->buffers,(ulong)(uint)buffer.m_value.number_unsigned._4_4_);
    SerializeGltfBuffer(buffer_00,(json *)&images.m_value);
    anon_unknown_57::JsonPushBack((json *)local_70,(json *)&images.m_value);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&images.m_value);
    buffer.m_value.number_integer._4_4_ = buffer.m_value.number_integer._4_4_ + 1;
  }
  anon_unknown_57::JsonAddMember((json *)local_38,"buffers",(json *)local_70);
  sVar1 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::size(&model->images);
  if (sVar1 != 0) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_98,(nullptr_t)0x0);
    sVar1 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::size(&model->images);
    anon_unknown_57::JsonReserveArray
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_98,sVar1);
    image.m_value.number_integer._4_4_ = 0;
    while( true ) {
      sVar1 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::size(&model->images);
      if (sVar1 <= (uint)image.m_value.number_unsigned._4_4_) break;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)((long)&dummystring.field_2 + 8),(nullptr_t)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_d0,"",&local_d1);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      pvVar2 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                         (&model->images,(ulong)(uint)image.m_value.number_unsigned._4_4_);
      UpdateImageObject(pvVar2,(string *)local_d0,image.m_value.number_integer._4_4_,false,
                        &this->WriteImageData,this->write_image_user_data_);
      pvVar2 = std::vector<tinygltf::Image,_std::allocator<tinygltf::Image>_>::operator[]
                         (&model->images,(ulong)(uint)image.m_value.number_unsigned._4_4_);
      SerializeGltfImage(pvVar2,(json *)((long)&dummystring.field_2 + 8));
      anon_unknown_57::JsonPushBack((json *)local_98,(json *)((long)&dummystring.field_2 + 8));
      std::__cxx11::string::~string((string *)local_d0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)((long)&dummystring.field_2 + 8));
      image.m_value.number_integer._4_4_ = image.m_value.number_integer._4_4_ + 1;
    }
    anon_unknown_57::JsonAddMember((json *)local_38,"images",(json *)local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_98);
  }
  if ((output.m_value.number_unsigned._6_1_ & 1) == 0) {
    anon_unknown_57::JsonToString
              (&local_118,(json *)local_38,((byte)output.m_value.number_unsigned._7_1_ & 1) - 1 | 2)
    ;
    WriteGltfStream(stream,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
  }
  else {
    anon_unknown_57::JsonToString(&local_f8,(json *)local_38,-1);
    WriteBinaryGltfStream(stream,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&buffers.m_value);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_38);
  return true;
}

Assistant:

bool TinyGLTF::WriteGltfSceneToStream(Model *model, std::ostream &stream,
                                      bool prettyPrint = true,
                                      bool writeBinary = false) {
  JsonDocument output;

  /// Serialize all properties except buffers and images.
  SerializeGltfModel(model, output);

  // BUFFERS
  std::vector<std::string> usedUris;
  json buffers;
  JsonReserveArray(buffers, model->buffers.size());
  for (unsigned int i = 0; i < model->buffers.size(); ++i) {
    json buffer;
    SerializeGltfBuffer(model->buffers[i], buffer);
    JsonPushBack(buffers, std::move(buffer));
  }
  JsonAddMember(output, "buffers", std::move(buffers));

  // IMAGES
  if (model->images.size()) {
    json images;
    JsonReserveArray(images, model->images.size());
    for (unsigned int i = 0; i < model->images.size(); ++i) {
      json image;

      std::string dummystring = "";
      // UpdateImageObject need baseDir but only uses it if embededImages is
      // enable, since we won't write separte images when writing to a stream we
      // use a dummystring
      UpdateImageObject(model->images[i], dummystring, int(i), false,
                        &this->WriteImageData, this->write_image_user_data_);
      SerializeGltfImage(model->images[i], image);
      JsonPushBack(images, std::move(image));
    }
    JsonAddMember(output, "images", std::move(images));
  }

  if (writeBinary) {
    WriteBinaryGltfStream(stream, JsonToString(output));
  } else {
    WriteGltfStream(stream, JsonToString(output, prettyPrint ? 2 : -1));
  }

  return true;
}